

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

float * __thiscall
sisl::array_n<float,_1,_std::allocator<float>_>::operator()
          (array_n<float,_1,_std::allocator<float>_> *this,uint d0,...)

{
  undefined8 *puVar1;
  va_list vl;
  
  if (d0 < this->_dims[0]) {
    return this->_array + d0;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "Index out of bounds!";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

inline T& operator()(unsigned int d0, ...) {
            unsigned int index = 0;
            va_list vl;
            va_start(vl, d0);
            index = linear_index(d0, vl);
            va_end(vl);

            return _array[index];
        }